

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O3

int prvTidytmbstrncasecmp(ctmbstr s1,ctmbstr s2,uint n)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char cVar4;
  ctmbstr ptVar5;
  bool bVar6;
  
  cVar4 = *s1;
  uVar1 = prvTidyToLower((int)cVar4);
  uVar2 = prvTidyToLower((int)*s2);
  ptVar5 = s2;
  if (uVar1 == uVar2) {
    do {
      bVar6 = n == 0;
      n = n - 1;
      if (cVar4 == '\0') {
        return 0;
      }
      if (bVar6) {
        return 0;
      }
      s2 = ptVar5 + 1;
      cVar4 = s1[1];
      s1 = s1 + 1;
      uVar1 = prvTidyToLower((int)cVar4);
      uVar2 = prvTidyToLower((int)ptVar5[1]);
      ptVar5 = s2;
    } while (uVar1 == uVar2);
  }
  if (n == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = (uint)(*s2 < *s1) * 2 + -1;
  }
  return iVar3;
}

Assistant:

int TY_(tmbstrncasecmp)( ctmbstr s1, ctmbstr s2, uint n )
{
    uint c;

    while (c = (uint)(*s1), TY_(ToLower)(c) == TY_(ToLower)((uint)(*s2)))
    {
        if (c == '\0')
            return 0;

        if (n == 0)
            return 0;

        ++s1;
        ++s2;
        --n;
    }

    if (n == 0)
        return 0;

    return (*s1 > *s2 ? 1 : -1);
}